

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Vector<kj::ArrayPtr<const_char>_> * __thiscall
kj::_::splitParts(Vector<kj::ArrayPtr<const_char>_> *__return_storage_ptr__,_ *this,
                 ArrayPtr<const_char> input,char delim)

{
  ArrayPtr<const_char> part;
  ArrayPtr<const_char> local_40;
  ArrayPtr<const_char> local_30;
  
  local_30.size_ = (size_t)input.ptr;
  (__return_storage_ptr__->builder).ptr = (ArrayPtr<const_char> *)0x0;
  (__return_storage_ptr__->builder).pos = (RemoveConst<kj::ArrayPtr<const_char>_> *)0x0;
  (__return_storage_ptr__->builder).endPtr = (ArrayPtr<const_char> *)0x0;
  (__return_storage_ptr__->builder).disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  local_30.ptr = (char *)this;
  while ((char *)local_30.size_ != (char *)0x0) {
    local_40 = splitNext(&local_30,(char)input.size_);
    stripLeadingAndTrailingSpace(&local_40);
    Vector<kj::ArrayPtr<char_const>>::add<kj::ArrayPtr<char_const>>
              ((Vector<kj::ArrayPtr<char_const>> *)__return_storage_ptr__,&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Vector<kj::ArrayPtr<const char>> splitParts(kj::ArrayPtr<const char> input, char delim) {
  // Given a string `input` and a delimiter `delim`, split the string into a vector of substrings,
  // separated by the delimiter. Note that leading/trailing whitespace is stripped from each element.
  kj::Vector<kj::ArrayPtr<const char>> parts;

  while (input.size() != 0) {
    auto part = splitNext(input, delim);
    stripLeadingAndTrailingSpace(part);
    parts.add(kj::mv(part));
  }

  return parts;
}